

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

PyObject * pybind11_meta_call(PyObject *type,PyObject *args,PyObject *kwargs)

{
  pointer pptVar1;
  pointer pptVar2;
  undefined8 uVar3;
  bool bVar4;
  PyObject *obj;
  PyTypeObject *type_00;
  iterator __begin2;
  values_and_holders vhs;
  string local_88;
  iterator local_68;
  values_and_holders local_38;
  
  obj = (PyObject *)(*_PyBuffer_Release)();
  if (obj == (PyObject *)0x0) {
LAB_0013fa58:
    obj = (PyObject *)0x0;
  }
  else {
    pybind11::detail::values_and_holders::values_and_holders(&local_38,obj);
    pybind11::detail::values_and_holders::begin(&local_68,&local_38);
    pptVar1 = ((local_38.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pptVar2 = ((local_38.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    while (local_68.curr.index != (long)pptVar1 - (long)pptVar2 >> 3) {
      bVar4 = pybind11::detail::value_and_holder::holder_constructed(&local_68.curr);
      if (!bVar4) {
        bVar4 = pybind11::detail::values_and_holders::is_redundant_value_and_holder
                          (&local_38,&local_68.curr);
        uVar3 = _PyExc_TypeError;
        if (!bVar4) {
          pybind11::detail::get_fully_qualified_tp_name_abi_cxx11_
                    (&local_88,(detail *)(local_68.curr.type)->type,type_00);
          PyErr_Format(uVar3,"%.200s.__init__() must be called when overriding __init__",
                       local_88._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_88);
          _Py_DECREF(obj);
          goto LAB_0013fa58;
        }
      }
      pybind11::detail::values_and_holders::iterator::operator++(&local_68);
    }
  }
  return obj;
}

Assistant:

inline PyObject *pybind11_meta_call(PyObject *type, PyObject *args, PyObject *kwargs) {

    // use the default metaclass call to create/initialize the object
    PyObject *self = PyType_Type.tp_call(type, args, kwargs);
    if (self == nullptr) {
        return nullptr;
    }

    // Ensure that the base __init__ function(s) were called
    values_and_holders vhs(self);
    for (const auto &vh : vhs) {
        if (!vh.holder_constructed() && !vhs.is_redundant_value_and_holder(vh)) {
            PyErr_Format(PyExc_TypeError,
                         "%.200s.__init__() must be called when overriding __init__",
                         get_fully_qualified_tp_name(vh.type->type).c_str());
            Py_DECREF(self);
            return nullptr;
        }
    }

    return self;
}